

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::SetExternalMakefileProjectGenerator
          (cmGlobalGenerator *this,cmExternalMakefileProjectGenerator *extraGenerator)

{
  bool bVar1;
  pointer pcVar2;
  cmExternalMakefileProjectGenerator *extraGenerator_local;
  cmGlobalGenerator *this_local;
  
  std::
  unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
  ::reset(&this->ExtraGenerator,extraGenerator);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->ExtraGenerator);
  if (bVar1) {
    pcVar2 = std::
             unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
             ::operator->(&this->ExtraGenerator);
    (*pcVar2->_vptr_cmExternalMakefileProjectGenerator[3])(pcVar2,this);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetExternalMakefileProjectGenerator(
  cmExternalMakefileProjectGenerator* extraGenerator)
{
  this->ExtraGenerator.reset(extraGenerator);
  if (this->ExtraGenerator) {
    this->ExtraGenerator->SetGlobalGenerator(this);
  }
}